

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void vdbeIncrFree(IncrMerger *pIncr)

{
  IncrMerger *pIncr_local;
  
  if (pIncr != (IncrMerger *)0x0) {
    if (pIncr->bUseThread != 0) {
      vdbeSorterJoinThread(pIncr->pTask);
      if (pIncr->aFile[0].pFd != (sqlite3_file *)0x0) {
        sqlite3OsCloseFree(pIncr->aFile[0].pFd);
      }
      if (pIncr->aFile[1].pFd != (sqlite3_file *)0x0) {
        sqlite3OsCloseFree(pIncr->aFile[1].pFd);
      }
    }
    vdbeMergeEngineFree(pIncr->pMerger);
    sqlite3_free(pIncr);
  }
  return;
}

Assistant:

static void vdbeIncrFree(IncrMerger *pIncr){
  if( pIncr ){
#if SQLITE_MAX_WORKER_THREADS>0
    if( pIncr->bUseThread ){
      vdbeSorterJoinThread(pIncr->pTask);
      if( pIncr->aFile[0].pFd ) sqlite3OsCloseFree(pIncr->aFile[0].pFd);
      if( pIncr->aFile[1].pFd ) sqlite3OsCloseFree(pIncr->aFile[1].pFd);
    }
#endif
    vdbeMergeEngineFree(pIncr->pMerger);
    sqlite3_free(pIncr);
  }
}